

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_str_delete_chars(nk_str *s,int pos,int len)

{
  int iVar1;
  char *src;
  char *dst;
  int len_local;
  int pos_local;
  nk_str *s_local;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1b9d,"void nk_str_delete_chars(struct nk_str *, int, int)");
  }
  if ((((s != (nk_str *)0x0) && (len != 0)) && ((ulong)(long)pos <= (s->buffer).allocated)) &&
     ((ulong)(long)(pos + len) <= (s->buffer).allocated)) {
    if ((ulong)(long)(pos + len) < (s->buffer).allocated) {
      nk_memcopy((void *)((long)(s->buffer).memory.ptr + (long)pos),
                 (void *)((long)(s->buffer).memory.ptr + (long)(pos + len)),
                 (s->buffer).allocated - (long)(pos + len));
      if ((int)(s->buffer).allocated - len < 0) {
        __assert_fail("((int)s->buffer.allocated - (int)len) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1ba6,"void nk_str_delete_chars(struct nk_str *, int, int)");
      }
      (s->buffer).allocated = (s->buffer).allocated - (long)len;
    }
    else {
      nk_str_remove_chars(s,len);
    }
    iVar1 = nk_utf_len((char *)(s->buffer).memory.ptr,(int)(s->buffer).allocated);
    s->len = iVar1;
  }
  return;
}

Assistant:

NK_API void
nk_str_delete_chars(struct nk_str *s, int pos, int len)
{
    NK_ASSERT(s);
    if (!s || !len || (nk_size)pos > s->buffer.allocated ||
        (nk_size)(pos + len) > s->buffer.allocated) return;

    if ((nk_size)(pos + len) < s->buffer.allocated) {
        /* memmove */
        char *dst = nk_ptr_add(char, s->buffer.memory.ptr, pos);
        char *src = nk_ptr_add(char, s->buffer.memory.ptr, pos + len);
        NK_MEMCPY(dst, src, s->buffer.allocated - (nk_size)(pos + len));
        NK_ASSERT(((int)s->buffer.allocated - (int)len) >= 0);
        s->buffer.allocated -= (nk_size)len;
    } else nk_str_remove_chars(s, len);
    s->len = nk_utf_len((char *)s->buffer.memory.ptr, (int)s->buffer.allocated);
}